

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::Arena::~Arena(Arena *this)

{
  uint64 uVar1;
  uint64 space_allocated;
  Arena *this_local;
  
  uVar1 = ResetInternal(this);
  if (*(long *)(this + 0x80) != 0) {
    (**(code **)(this + 0x80))(this,*(undefined8 *)(this + 0x38),uVar1);
  }
  internal::Mutex::~Mutex((Mutex *)(this + 0x30));
  return;
}

Assistant:

Arena::~Arena() {
  uint64 space_allocated = ResetInternal();

  // Call the destruction hook
  if (options_.on_arena_destruction != NULL) {
    options_.on_arena_destruction(this, hooks_cookie_, space_allocated);
  }
#if defined(__APPLE__)
    delete lifecycle_id_generator_ptr;
#endif
}